

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

HelicsPublication
anon_unknown.dwarf_694c0::addPublication
          (HelicsFederate fed,
          unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
          *pub)

{
  PublicationObject *pPVar1;
  __normal_iterator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_*,_std::vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>_>
  __position;
  
  pPVar1 = (pub->_M_t).
           super___uniq_ptr_impl<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>
           .super__Head_base<0UL,_helics::PublicationObject_*,_false>._M_head_impl;
  pPVar1->valid = -0x684eff5b;
  if ((*(long *)((long)fed + 0x68) != *(long *)((long)fed + 0x70)) &&
     ((pPVar1->pubPtr->super_Interface).handle.hid <=
      *(int *)(*(long *)(*(long *)(*(long *)((long)fed + 0x70) + -8) + 0x18) + 0x10))) {
    __position = std::
                 upper_bound<__gnu_cxx::__normal_iterator<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>*,std::vector<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>,std::allocator<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>>>>,helics::InterfaceHandle,(anonymous_namespace)::__1>
                           ();
    std::
    vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
    ::_M_insert_rval((vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
                      *)((long)fed + 0x68),(const_iterator)__position._M_current,pub);
    return pPVar1;
  }
  std::
  vector<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>,std::allocator<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>>>
  ::
  emplace_back<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>>
            ((vector<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>,std::allocator<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>>>
              *)((long)fed + 0x68),pub);
  return pPVar1;
}

Assistant:

HelicsPublication addPublication(HelicsFederate fed, std::unique_ptr<helics::PublicationObject> pub)
{
    auto* fedObj = reinterpret_cast<helics::FedObject*>(fed);
    pub->valid = PublicationValidationIdentifier;
    HelicsPublication hpub = pub.get();
    if (fedObj->pubs.empty() || pub->pubPtr->getHandle() > fedObj->pubs.back()->pubPtr->getHandle()) {
        fedObj->pubs.push_back(std::move(pub));
    } else {
        auto ind = std::upper_bound(fedObj->pubs.begin(), fedObj->pubs.end(), pub->pubPtr->getHandle(), pubSearch);
        fedObj->pubs.insert(ind, std::move(pub));
    }

    return hpub;
}